

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

FT_Error ps_dimension_add_t1stem
                   (PS_Dimension dim,FT_Int pos,FT_Int len,FT_Memory memory,FT_UInt *aindex)

{
  uint uVar1;
  uint uVar2;
  FT_Error FVar3;
  PS_Hint block;
  ulong uVar4;
  uint uVar5;
  FT_Int *pFVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  FT_Error error;
  int local_4c;
  FT_Memory local_48;
  FT_UInt *local_40;
  PS_Mask local_38;
  
  uVar5 = 0;
  iVar7 = 0;
  if (0 < len) {
    iVar7 = len;
  }
  iVar9 = pos + -0x15;
  if (len != -0x15) {
    iVar9 = pos;
  }
  uVar1 = (dim->hints).num_hints;
  block = (dim->hints).hints;
  if (uVar1 != 0) {
    pFVar6 = &block->len;
    do {
      if ((((PS_HintRec_ *)(pFVar6 + -1))->pos == iVar9) && (*pFVar6 == iVar7)) goto LAB_00239826;
      uVar5 = uVar5 + 1;
      pFVar6 = pFVar6 + 3;
    } while (uVar1 != uVar5);
  }
  uVar5 = uVar1 + 1;
  uVar2 = (dim->hints).max_hints;
  if (uVar2 < uVar5) {
    uVar8 = (uVar1 & 0xfffffff8) + 8;
    local_48 = memory;
    local_40 = aindex;
    block = (PS_Hint)ft_mem_qrealloc(memory,0xc,(ulong)uVar2,(ulong)uVar8,block,&local_4c);
    (dim->hints).hints = block;
    if (local_4c != 0) {
      return local_4c;
    }
    (dim->hints).max_hints = uVar8;
    memory = local_48;
    aindex = local_40;
  }
  (dim->hints).num_hints = uVar5;
  block[(ulong)uVar5 - 1].pos = iVar9;
  block[(ulong)uVar5 - 1].len = iVar7;
  block[(ulong)uVar5 - 1].flags = len >> 0x1f & (uint)(len == -0x15) * 2 + 1;
  uVar5 = uVar1;
LAB_00239826:
  uVar4 = (ulong)(dim->masks).num_masks;
  if (uVar4 == 0) {
    FVar3 = ps_mask_table_alloc(&dim->masks,memory,&local_38);
    if (FVar3 != 0) {
      return FVar3;
    }
  }
  else {
    local_38 = (dim->masks).masks + (uVar4 - 1);
  }
  FVar3 = ps_mask_set_bit(local_38,uVar5,memory);
  if ((FVar3 == 0) && (FVar3 = 0, aindex != (FT_UInt *)0x0)) {
    *aindex = uVar5;
  }
  return FVar3;
}

Assistant:

static FT_Error
  ps_dimension_add_t1stem( PS_Dimension  dim,
                           FT_Int        pos,
                           FT_Int        len,
                           FT_Memory     memory,
                           FT_UInt      *aindex )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   flags = 0;


    /* detect ghost stem */
    if ( len < 0 )
    {
      flags |= PS_HINT_FLAG_GHOST;
      if ( len == -21 )
      {
        flags |= PS_HINT_FLAG_BOTTOM;
        pos    = ADD_INT( pos, len );
      }
      len = 0;
    }

    /* now, lookup stem in the current hints table */
    {
      PS_Mask  mask;
      FT_UInt  idx;
      FT_UInt  max  = dim->hints.num_hints;
      PS_Hint  hint = dim->hints.hints;


      for ( idx = 0; idx < max; idx++, hint++ )
      {
        if ( hint->pos == pos && hint->len == len )
          break;
      }

      /* we need to create a new hint in the table */
      if ( idx >= max )
      {
        error = ps_hint_table_alloc( &dim->hints, memory, &hint );
        if ( error )
          goto Exit;

        hint->pos   = pos;
        hint->len   = len;
        hint->flags = flags;
      }

      /* now, store the hint in the current mask */
      error = ps_mask_table_last( &dim->masks, memory, &mask );
      if ( error )
        goto Exit;

      error = ps_mask_set_bit( mask, idx, memory );
      if ( error )
        goto Exit;

      if ( aindex )
        *aindex = idx;
    }

  Exit:
    return error;
  }